

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O3

bool __thiscall
ON_Viewport::GetFarRect
          (ON_Viewport *this,ON_3dPoint *left_bottom,ON_3dPoint *right_bottom,ON_3dPoint *left_top,
          ON_3dPoint *right_top)

{
  double dVar1;
  bool bVar2;
  double y;
  double x;
  ON_Plane far_plane;
  double local_d8;
  double local_d0;
  ON_3dPoint local_c8;
  ON_Plane local_b0;
  
  ON_Plane::ON_Plane(&local_b0);
  bVar2 = GetFarPlane(this,&local_b0);
  if (bVar2) {
    if (this->m_projection == perspective_view) {
      dVar1 = this->m_frus_far / this->m_frus_near;
    }
    else {
      dVar1 = 1.0;
    }
    local_d0 = 1.0;
    local_d8 = 1.0;
    GetViewScale(this,&local_d0,&local_d8,(double *)0x0);
    local_d0 = 1.0 / local_d0;
    local_d8 = 1.0 / local_d8;
    ON_Plane::PointAt(&local_c8,&local_b0,local_d0 * dVar1 * this->m_frus_left,
                      local_d8 * dVar1 * this->m_frus_bottom);
    left_bottom->z = local_c8.z;
    left_bottom->x = local_c8.x;
    left_bottom->y = local_c8.y;
    ON_Plane::PointAt(&local_c8,&local_b0,local_d0 * dVar1 * this->m_frus_right,
                      local_d8 * dVar1 * this->m_frus_bottom);
    right_bottom->z = local_c8.z;
    right_bottom->x = local_c8.x;
    right_bottom->y = local_c8.y;
    ON_Plane::PointAt(&local_c8,&local_b0,local_d0 * dVar1 * this->m_frus_left,
                      local_d8 * dVar1 * this->m_frus_top);
    left_top->z = local_c8.z;
    left_top->x = local_c8.x;
    left_top->y = local_c8.y;
    ON_Plane::PointAt(&local_c8,&local_b0,local_d0 * dVar1 * this->m_frus_right,
                      dVar1 * local_d8 * this->m_frus_top);
    right_top->z = local_c8.z;
    right_top->x = local_c8.x;
    right_top->y = local_c8.y;
  }
  ON_Plane::~ON_Plane(&local_b0);
  return bVar2;
}

Assistant:

bool ON_Viewport::GetFarRect( 
       ON_3dPoint& left_bottom,
       ON_3dPoint& right_bottom,
       ON_3dPoint& left_top,
       ON_3dPoint& right_top
       ) const
{
  ON_Plane far_plane;
  bool rc = GetFarPlane( far_plane );
  if (rc )
  {
    double s = IsPerspectiveProjection()
            ? m_frus_far/m_frus_near
            : 1.0;
    double x = 1.0, y = 1.0;
    GetViewScale(&x,&y);
    x = 1.0/x;
    y = 1.0/y;
    left_bottom  = far_plane.PointAt( s*x*m_frus_left,  s*y*m_frus_bottom );
    right_bottom = far_plane.PointAt( s*x*m_frus_right, s*y*m_frus_bottom );
    left_top     = far_plane.PointAt( s*x*m_frus_left,  s*y*m_frus_top );
    right_top    = far_plane.PointAt( s*x*m_frus_right, s*y*m_frus_top );
  }
  return rc;
}